

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_temp_var.hpp
# Opt level: O0

string * __thiscall
optimization::remove_temp_var::Remove_Temp_Var::pass_name_abi_cxx11_(Remove_Temp_Var *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x38));
  return in_RDI;
}

Assistant:

std::string pass_name() const { return name; }